

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

size_t ssh2_try_send(ssh2_channel *c)

{
  ssh2_connection_state *psVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  bufchain *local_50;
  undefined1 local_40 [8];
  ptrlen data;
  bufchain *buf;
  size_t bufsize;
  PktOut *pktout;
  ssh2_connection_state *s;
  ssh2_channel *c_local;
  
  psVar1 = c->connlayer;
  if ((c->halfopen & 1U) == 0) {
    while( true ) {
      bVar4 = false;
      if (c->remwindow != 0) {
        sVar2 = bufchain_size(&c->outbuffer);
        bVar4 = true;
        if (sVar2 == 0) {
          sVar2 = bufchain_size(&c->errbuffer);
          bVar4 = sVar2 != 0;
        }
      }
      if (!bVar4) break;
      sVar2 = bufchain_size(&c->errbuffer);
      if (sVar2 == 0) {
        local_50 = &c->outbuffer;
      }
      else {
        local_50 = &c->errbuffer;
      }
      _local_40 = bufchain_prefix(local_50);
      if ((void *)(ulong)c->remwindow < data.ptr) {
        data.ptr._0_4_ = c->remwindow;
        data.ptr._4_4_ = 0;
      }
      if ((void *)(ulong)c->remmaxpkt < data.ptr) {
        data.ptr._0_4_ = c->remmaxpkt;
        data.ptr._4_4_ = 0;
      }
      if (local_50 == &c->errbuffer) {
        bufsize = (size_t)ssh_bpp_new_pktout((psVar1->ppl).bpp,0x5f);
        BinarySink_put_uint32(((PktOut *)bufsize)->binarysink_,(ulong)c->remoteid);
        BinarySink_put_uint32(((PktOut *)bufsize)->binarysink_,1);
      }
      else {
        bufsize = (size_t)ssh_bpp_new_pktout((psVar1->ppl).bpp,0x5e);
        BinarySink_put_uint32(((PktOut *)bufsize)->binarysink_,(ulong)c->remoteid);
      }
      BinarySink_put_stringpl((BinarySink *)(bufsize + 0x60),_local_40);
      pq_base_push(&((psVar1->ppl).out_pq)->pqb,(PacketQueueNode *)(bufsize + 0x40));
      bufchain_consume(local_50,(size_t)data.ptr);
      c->remwindow = c->remwindow - local_40._8_4_;
    }
  }
  sVar2 = bufchain_size(&c->outbuffer);
  sVar3 = bufchain_size(&c->errbuffer);
  if ((sVar2 + sVar3 == 0) && ((c->pending_eof & 1U) != 0)) {
    ssh2_channel_try_eof(c);
  }
  ssh_sendbuffer_changed((psVar1->ppl).ssh);
  return sVar2 + sVar3;
}

Assistant:

static size_t ssh2_try_send(struct ssh2_channel *c)
{
    struct ssh2_connection_state *s = c->connlayer;
    PktOut *pktout;
    size_t bufsize;

    if (!c->halfopen) {
        while (c->remwindow > 0 &&
               (bufchain_size(&c->outbuffer) > 0 ||
                bufchain_size(&c->errbuffer) > 0)) {
            bufchain *buf = (bufchain_size(&c->errbuffer) > 0 ?
                             &c->errbuffer : &c->outbuffer);

            ptrlen data = bufchain_prefix(buf);
            if (data.len > c->remwindow)
                data.len = c->remwindow;
            if (data.len > c->remmaxpkt)
                data.len = c->remmaxpkt;
            if (buf == &c->errbuffer) {
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH2_MSG_CHANNEL_EXTENDED_DATA);
                put_uint32(pktout, c->remoteid);
                put_uint32(pktout, SSH2_EXTENDED_DATA_STDERR);
            } else {
                pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_CHANNEL_DATA);
                put_uint32(pktout, c->remoteid);
            }
            put_stringpl(pktout, data);
            pq_push(s->ppl.out_pq, pktout);
            bufchain_consume(buf, data.len);
            c->remwindow -= data.len;
        }
    }

    /*
     * After having sent as much data as we can, return the amount
     * still buffered.
     */
    bufsize = bufchain_size(&c->outbuffer) + bufchain_size(&c->errbuffer);

    /*
     * And if there's no data pending but we need to send an EOF, send
     * it.
     */
    if (!bufsize && c->pending_eof)
        ssh2_channel_try_eof(c);

    ssh_sendbuffer_changed(s->ppl.ssh);
    return bufsize;
}